

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_dict.cpp
# Opt level: O2

void duckdb_brotli::BrotliCleanupSharedEncoderDictionary
               (MemoryManager *m,SharedEncoderDictionary *dict)

{
  BrotliEncoderDictionary *p;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  for (uVar2 = 0; uVar2 < (dict->compound).num_prepared_instances_; uVar2 = uVar2 + 1) {
    DestroyPreparedDictionary(m,(dict->compound).prepared_instances_[uVar2]);
  }
  uVar2 = (dict->contextual).num_instances_;
  if (uVar2 != 0) {
    if (uVar2 == 1) {
      BrotliDestroyEncoderDictionary(m,&(dict->contextual).instance_);
      return;
    }
    lVar3 = 0;
    for (uVar1 = 0; p = (dict->contextual).instances_, uVar1 < uVar2; uVar1 = uVar1 + 1) {
      BrotliDestroyEncoderDictionary(m,(BrotliEncoderDictionary *)((long)&p->words + lVar3));
      uVar2 = (dict->contextual).num_instances_;
      lVar3 = lVar3 + 0xa8;
    }
    BrotliFree(m,p);
    return;
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliCleanupSharedEncoderDictionary(MemoryManager* m,
                                          SharedEncoderDictionary* dict) {
  size_t i;
  for (i = 0; i < dict->compound.num_prepared_instances_; i++) {
    DestroyPreparedDictionary(m,
        (PreparedDictionary*)dict->compound.prepared_instances_[i]);
  }
  if (dict->contextual.num_instances_ == 1) {
    BrotliDestroyEncoderDictionary(m, &dict->contextual.instance_);
  } else if (dict->contextual.num_instances_ > 1) {
    for (i = 0; i < dict->contextual.num_instances_; i++) {
      BrotliDestroyEncoderDictionary(m, &dict->contextual.instances_[i]);
    }
    BrotliFree(m, dict->contextual.instances_);
  }
}